

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Result * __thiscall
kj::anon_unknown_36::WebSocketImpl::ZlibContext::pumpOnce
          (Result *__return_storage_ptr__,ZlibContext *this)

{
  bool bVar1;
  uchar *puVar2;
  Array<unsigned_char> *other;
  bool local_121;
  bool local_111;
  Fault local_d8;
  Fault f_1;
  int *local_c8;
  DebugComparison<int_&,_int> local_c0;
  bool local_91;
  bool _kjCondition_1;
  Fault f;
  int *local_80;
  DebugComparison<int_&,_int> local_78;
  bool local_49;
  int local_48;
  bool _kjCondition;
  int result;
  undefined1 local_38 [8];
  Array<unsigned_char> buffer;
  size_t bufSize;
  ZlibContext *this_local;
  
  buffer.disposer = (ArrayDisposer *)0x1000;
  heapArray<unsigned_char>((Array<unsigned_char> *)local_38,0x1000);
  puVar2 = Array<unsigned_char>::begin((Array<unsigned_char> *)local_38);
  (this->ctx).next_out = puVar2;
  (this->ctx).avail_out = (uInt)buffer.disposer;
  local_48 = 0;
  if (this->mode == COMPRESS) {
    local_48 = deflate(&this->ctx,2);
    local_80 = (int *)kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_48);
    f.exception._4_4_ = 0;
    kj::_::DebugExpression<int&>::operator==
              (&local_78,(DebugExpression<int&> *)&local_80,(int *)((long)&f.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_78);
    local_111 = true;
    if ((!bVar1) && (local_111 = true, local_48 != -5)) {
      local_111 = local_48 == 1;
    }
    local_49 = local_111;
    if (local_111 == false) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[19],int&>
                ((Fault *)&stack0xffffffffffffff70,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0xd2a,FAILED,"result == Z_OK || result == Z_BUF_ERROR || result == Z_STREAM_END",
                 "_kjCondition,\"Compression failed\", result",&local_49,
                 (char (*) [19])"Compression failed",&local_48);
      kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffff70);
    }
  }
  else if (this->mode == DECOMPRESS) {
    local_48 = inflate(&this->ctx,2);
    local_c8 = (int *)kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_48);
    f_1.exception._4_4_ = 0;
    kj::_::DebugExpression<int&>::operator==
              (&local_c0,(DebugExpression<int&> *)&local_c8,(int *)((long)&f_1.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_c0);
    local_121 = true;
    if ((!bVar1) && (local_121 = true, local_48 != -5)) {
      local_121 = local_48 == 1;
    }
    local_91 = local_121;
    if (local_121 == false) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,bool&,char_const(&)[21],int&,char_const(&)[13],char*&>
                (&local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0xd2f,FAILED,"result == Z_OK || result == Z_BUF_ERROR || result == Z_STREAM_END",
                 "_kjCondition,\"Decompression failed\", result, \" with reason\", ctx.msg",
                 &local_91,(char (*) [21])"Decompression failed",&local_48,
                 (char (*) [13])" with reason",&(this->ctx).msg);
      kj::_::Debug::Fault::fatal(&local_d8);
    }
  }
  __return_storage_ptr__->processResult = local_48;
  other = mv<kj::Array<unsigned_char>>((Array<unsigned_char> *)local_38);
  Array<const_unsigned_char>::Array(&__return_storage_ptr__->buffer,other);
  __return_storage_ptr__->size = (long)buffer.disposer - (ulong)(this->ctx).avail_out;
  Array<unsigned_char>::~Array((Array<unsigned_char> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

Result pumpOnce() {
      // Prepares Zlib's internal state for a call to deflate/inflate, then calls the relevant
      // function to process the input buffer. It is assumed that the caller has already set up
      // Zlib's input buffer.
      //
      // Since calls to deflate/inflate will process data until the input is empty, or until the
      // output is full, multiple calls to `pumpOnce()` may be required to process the entire
      // message. We're done processing once either `result` is `Z_STREAM_END`, or we get
      // `Z_BUF_ERROR` and did not write any more output.
      size_t bufSize = 4096;
      Array<kj::byte> buffer = kj::heapArray<kj::byte>(bufSize);
      ctx.next_out = buffer.begin();
      ctx.avail_out = bufSize;

      int result = Z_OK;

      switch (mode) {
        case Mode::COMPRESS:
          result = deflate(&ctx, Z_SYNC_FLUSH);
          KJ_REQUIRE(result == Z_OK || result == Z_BUF_ERROR || result == Z_STREAM_END,
                      "Compression failed", result);
          break;
        case Mode::DECOMPRESS:
          result = inflate(&ctx, Z_SYNC_FLUSH);
          KJ_REQUIRE(result == Z_OK || result == Z_BUF_ERROR || result == Z_STREAM_END,
                      "Decompression failed", result, " with reason", ctx.msg);
          break;
      }

      return Result {
        result,
        kj::mv(buffer),
        bufSize - ctx.avail_out,
      };
    }